

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QGles2UniformDescription>::emplace_back_impl<QGles2UniformDescription>
          (QVLABase<QGles2UniformDescription> *this,qsizetype prealloc,void *array,
          QGles2UniformDescription *args)

{
  qsizetype *pqVar1;
  reference pvVar2;
  int iVar3;
  int iVar4;
  quint32 qVar5;
  long asize;
  long aalloc;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (reference)((long)(this->super_QVLABaseBase).ptr + asize * 0x18);
  iVar3 = args->arrayDim;
  pvVar2->size = args->size;
  pvVar2->arrayDim = iVar3;
  iVar3 = args->glslLocation;
  iVar4 = args->binding;
  qVar5 = args->offset;
  pvVar2->type = args->type;
  pvVar2->glslLocation = iVar3;
  pvVar2->binding = iVar4;
  pvVar2->offset = qVar5;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return pvVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }